

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool __thiscall
kj::ArrayPtr<const_unsigned_char>::operator==
          (ArrayPtr<const_unsigned_char> *this,ArrayPtr<const_unsigned_char> *other)

{
  uchar uVar1;
  uchar *puVar2;
  ulong local_28;
  size_t i;
  ArrayPtr<const_unsigned_char> *other_local;
  ArrayPtr<const_unsigned_char> *this_local;
  
  if (this->size_ == other->size_) {
    for (local_28 = 0; local_28 < this->size_; local_28 = local_28 + 1) {
      uVar1 = this->ptr[local_28];
      puVar2 = operator[](other,local_28);
      if (uVar1 != *puVar2) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator==(const ArrayPtr& other) const {
    if (size_ != other.size_) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }